

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O2

bool ClientUtils::IsValidMulticastIP(string *i_MulticastIPAddress)

{
  pointer pbVar1;
  uint uVar2;
  bool bVar3;
  address_v4 Address;
  undefined1 local_14c [8];
  undefined1 local_144 [12];
  io_service Service;
  string local_128;
  iterator End;
  basic_resolver_iterator<boost::asio::ip::tcp> local_e8;
  resolver Resolver;
  query Query;
  
  boost::asio::io_context::io_context(&Service);
  local_14c._4_4_ = 0;
  local_144[0] = '\0';
  local_144._4_8_ = boost::system::system_category();
  boost::asio::ip::make_address_v4((string *)&Address,(error_code *)i_MulticastIPAddress);
  if (local_144[0] == '\x01') {
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::io_object_impl<boost::asio::io_context>(&Resolver.impl_,&Service,(type *)0x0);
    std::__cxx11::string::string((string *)&local_128,"",(allocator *)&local_e8);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
              (&Query,i_MulticastIPAddress,&local_128,address_configured);
    std::__cxx11::string::~string((string *)&local_128);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::resolve((results_type *)&local_128,&Resolver,&Query,(error_code *)(local_14c + 4));
    local_e8.index_ = local_128.field_2._M_allocated_capacity;
    local_e8.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_e8.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_128._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    End.index_ = 0;
    End.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    End.values_.
    super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_144[0] == '\0') {
      while( true ) {
        bVar3 = boost::asio::ip::operator!=(&local_e8,&End);
        if (!bVar3) break;
        local_144._4_8_ = boost::system::system_category();
        local_14c._4_4_ = 0;
        local_144[0] = '\0';
        pbVar1 = ((local_e8.values_.
                   super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->
                 super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(short *)&pbVar1[local_e8.index_].endpoint_.impl_.data_ == 2) {
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity = 0;
          local_128.field_2._8_8_ = 0;
          local_128._M_dataplus._M_p =
               (pointer)((ulong)*(uint *)((long)&pbVar1[local_e8.index_].endpoint_.impl_.data_ + 4)
                        << 0x20);
          boost::asio::ip::address::to_v4((address *)local_14c);
          Address.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_14c._0_4_;
          break;
        }
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(&local_e8);
      }
    }
    else {
      Address.addr_.s_addr = (in4_addr_type)0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&End.values_.
                super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_e8.values_.
                super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query(&Query);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&Resolver.impl_);
  }
  uVar2 = (uint)Address.addr_.s_addr & 0xf0;
  bVar3 = Address.addr_.s_addr == 0xffffffff;
  boost::asio::execution_context::~execution_context(&Service.super_execution_context);
  return bVar3 || uVar2 == 0xe0;
}

Assistant:

bool IsValidMulticastIP( const std::string & i_MulticastIPAddress )
  {
    boost::asio::io_service Service;
    boost::system::error_code Error;
    boost::asio::ip::address_v4 Address = boost::asio::ip::address_v4::from_string( i_MulticastIPAddress, Error );
    if( Error )
    {
      boost::asio::ip::tcp::resolver Resolver( Service );
      boost::asio::ip::tcp::resolver::query Query( i_MulticastIPAddress, "" );
      
      boost::asio::ip::tcp::resolver::iterator It = Resolver.resolve( Query, Error );
      boost::asio::ip::tcp::resolver::iterator End;
      
      if( ! Error )
      {
        for( ; It != End; ++It )
        {
          Error = boost::system::error_code();
          boost::asio::ip::tcp::endpoint EndPoint( *It );

          // Currently we only handle IPv4
          if( EndPoint.address().is_v4() )
          {
            Address = EndPoint.address().to_v4();
            break;
          }
        }
      }
      else
      {
        Address = boost::asio::ip::address_v4();
      }
    }

    return( Address.is_multicast() || ( Address.to_ulong() == 0xFFFFFFFF ) );
  }